

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window,QTouchEvent *te)

{
  uchar uVar1;
  QEventPointPrivate *pQVar2;
  QWidget *this;
  bool bVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  QApplicationPrivate *device;
  iterator touchPoint;
  iterator iVar9;
  QPoint QVar10;
  int *piVar11;
  int *piVar12;
  QPoint QVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined4 uVar18;
  QApplicationPrivate *this_00;
  QWidget *widget;
  QWidget *pQVar19;
  QPoint this_01;
  uint uVar20;
  Data *pDVar21;
  long in_FS_OFFSET;
  double dVar22;
  undefined1 auVar23 [16];
  QWidget *targetWidget;
  QMutableTouchEvent touchEvent;
  byte bVar24;
  QObject *o;
  QPoint local_b0;
  QArrayDataPointer<QEventPoint> local_a8;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> local_90;
  undefined1 local_88 [24];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QWidget *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d = (Data *)0x0;
  device = (QApplicationPrivate *)QPointerEvent::pointingDevice();
  local_a8.d = *(Data **)(te + 0x28);
  local_a8.ptr = *(QEventPoint **)(te + 0x30);
  local_a8.size = *(qsizetype *)(te + 0x38);
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  touchPoint = QList<QEventPoint>::begin((QList<QEventPoint> *)&local_a8);
  iVar9 = QList<QEventPoint>::end((QList<QEventPoint> *)&local_a8);
  for (; touchPoint.i != iVar9.i; touchPoint.i = touchPoint.i + 1) {
    cVar4 = QEventPoint::state();
    if (cVar4 == '\x01') {
      iVar7 = QInputDevice::type();
      bVar5 = true;
      if (((iVar7 == 4) &&
          (QVar10 = (QPoint)QPointingDevicePrivate::firstActiveTarget(), QVar10 != (QPoint)0x0)) &&
         (piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar10),
         piVar11 != (int *)0x0)) {
        if (piVar11[1] == 0) {
          bVar5 = false;
          goto LAB_002c0bc5;
        }
LAB_002c0da5:
        this_00 = device;
        iVar7 = QInputDevice::type();
        if (iVar7 == 2) {
          QVar13 = (QPoint)findClosestTouchPointTarget
                                     (this_00,(QPointingDevice *)device,touchPoint.i);
          if ((piVar11 == (int *)0x0) || (this_01 = QVar10, piVar11[1] == 0)) {
            this_01.xp.m_i = 0;
            this_01.yp.m_i = 0;
          }
          if ((QVar13 == (QPoint)0x0) ||
             ((bVar5 = QWidget::isAncestorOf((QWidget *)this_01,(QWidget *)QVar13), !bVar5 &&
              (bVar5 = QWidget::isAncestorOf((QWidget *)QVar13,(QWidget *)this_01), !bVar5))))
          goto LAB_002c0e2e;
          piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar13);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              operator_delete(piVar11);
            }
          }
          QInputDevice::type();
          QVar10 = QVar13;
          piVar11 = piVar12;
LAB_002c0e42:
          if ((piVar11 == (int *)0x0) || (QVar13 = QVar10, piVar11[1] == 0)) {
            QVar13.xp.m_i = 0;
            QVar13.yp.m_i = 0;
          }
          QMutableEventPoint::setTarget(touchPoint.i,(QObject *)QVar13);
        }
        else {
LAB_002c0e2e:
          iVar7 = QInputDevice::type();
          if (iVar7 == 4) goto LAB_002c0e42;
        }
        if (piVar11 == (int *)0x0) {
          piVar11 = (int *)0x0;
LAB_002c0e6d:
          QVar10.xp.m_i = 0;
          QVar10.yp.m_i = 0;
        }
        else {
LAB_002c0e62:
          if (piVar11[1] == 0) goto LAB_002c0e6d;
        }
        local_b0 = QVar10;
        QHash<QWidget*,std::pair<QEventPoint::State,QList<QEventPoint>>>::
        tryEmplace_impl<QWidget*const&>
                  ((TryEmplaceResult *)local_88,&local_90,(QWidget **)&local_b0);
        lVar16 = ((ulong)local_88._8_8_ >> 7) * 0x90;
        lVar16 = *(long *)(*(long *)(local_88._0_8_ + 0x20) + 0x80 + lVar16) +
                 (ulong)*(byte *)((ulong)((uint)local_88._8_8_ & 0x7f) +
                                 *(long *)(local_88._0_8_ + 0x20) + lVar16) * 0x28;
        bVar24 = *(byte *)(lVar16 + 8);
        bVar6 = QEventPoint::state();
        *(byte *)(lVar16 + 8) = bVar6 | bVar24;
        QtPrivate::QMovableArrayOps<QEventPoint>::emplace<QEventPoint_const&>
                  ((QMovableArrayOps<QEventPoint> *)(lVar16 + 0x10),*(qsizetype *)(lVar16 + 0x20),
                   touchPoint.i);
        QList<QEventPoint>::end((QList<QEventPoint> *)(lVar16 + 0x10));
      }
      else {
        piVar11 = (int *)0x0;
LAB_002c0bc5:
        if ((QPoint)window != (QPoint)0x0) {
LAB_002c0c7a:
          auVar23 = QEventPoint::globalPosition();
          dVar22 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar23._0_8_;
          bVar3 = 2147483647.0 < dVar22;
          if (dVar22 <= -2147483648.0) {
            dVar22 = -2147483648.0;
          }
          local_b0.xp.m_i =
               (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar22);
          dVar22 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar23._8_8_;
          bVar3 = 2147483647.0 < dVar22;
          if (dVar22 <= -2147483648.0) {
            dVar22 = -2147483648.0;
          }
          local_b0.yp.m_i =
               (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar22);
          local_88._0_8_ = QWidget::mapFromGlobal(window,&local_b0);
          QVar10 = (QPoint)QWidget::childAt(window,(QPoint *)local_88);
          if (QVar10 == (QPoint)0x0) {
            piVar12 = (int *)0x0;
          }
          else {
            piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar10);
          }
          if (!bVar5) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              operator_delete(piVar11);
            }
          }
          if (piVar12 == (int *)0x0) {
            piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef
                                       (&window->super_QObject);
            QVar10 = (QPoint)window;
          }
          else {
            piVar11 = piVar12;
            if (piVar12[1] == 0 || QVar10 == (QPoint)0x0) {
              piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef
                                         (&window->super_QObject);
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              QVar10 = (QPoint)window;
              if (*piVar12 == 0) {
                operator_delete(piVar12);
              }
            }
          }
          goto LAB_002c0da5;
        }
        auVar23 = QEventPoint::globalPosition();
        dVar22 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._0_8_;
        bVar3 = 2147483647.0 < dVar22;
        if (dVar22 <= -2147483648.0) {
          dVar22 = -2147483648.0;
        }
        local_88._0_4_ =
             (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar22);
        dVar22 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._8_8_;
        bVar3 = 2147483647.0 < dVar22;
        if (dVar22 <= -2147483648.0) {
          dVar22 = -2147483648.0;
        }
        local_88._4_4_ =
             (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar22);
        window = QApplication::topLevelAt((QPoint *)local_88);
        if ((QPoint)window != (QPoint)0x0) goto LAB_002c0c7a;
        window._0_4_ = 0;
        window._4_4_ = 0;
      }
      if (piVar11 != (int *)0x0) {
LAB_002c0ef7:
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          operator_delete(piVar11);
        }
      }
    }
    else {
      pQVar2 = ((touchPoint.i)->d).d.ptr;
      lVar16 = *(long *)(pQVar2 + 0x20);
      if ((((lVar16 != 0) && (*(int *)(lVar16 + 4) != 0)) &&
          (QVar10 = *(QPoint *)(pQVar2 + 0x28), QVar10 != (QPoint)0x0)) &&
         (piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar10),
         piVar11 != (int *)0x0)) {
        if (piVar11[1] != 0) goto LAB_002c0e62;
        goto LAB_002c0ef7;
      }
    }
  }
  if ((local_90.d == (Data *)0x0) || ((local_90.d)->size == 0)) {
LAB_002c132e:
    o = (QObject *)0x0;
  }
  else {
    pDVar21 = local_90.d;
    if ((local_90.d)->spans->offsets[0] == 0xff) {
      uVar15 = 1;
      do {
        uVar17 = uVar15;
        if ((local_90.d)->numBuckets == uVar17) {
          uVar17 = 0;
          pDVar21 = (Data *)0x0;
          break;
        }
        uVar15 = uVar17 + 1;
      } while ((local_90.d)->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
      if (pDVar21 == (Data *)0x0 && uVar17 == 0) goto LAB_002c132e;
    }
    else {
      uVar17 = 0;
    }
    o = (QObject *)0x0;
    do {
      uVar15 = uVar17 >> 7;
      uVar20 = (uint)uVar17 & 0x7f;
      this = *(QWidget **)
              pDVar21->spans[uVar15].entries[pDVar21->spans[uVar15].offsets[uVar20]].storage.data;
      pQVar19 = (QWidget *)0x1;
      if ((this == (QWidget *)0x0) ||
         (piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this->super_QObject),
         piVar11 == (int *)0x0)) {
        piVar11 = (int *)0x0;
        widget = (QWidget *)0x0;
      }
      else {
        pQVar19 = (QWidget *)0x0;
        widget = this;
        if (piVar11[1] == 0) {
          widget = pQVar19;
        }
      }
      bVar5 = tryModalHelper(widget,(QWidget **)0x0);
      cVar4 = (char)pQVar19;
      if (bVar5) {
        uVar1 = pDVar21->spans[uVar15].entries[pDVar21->spans[uVar15].offsets[uVar20]].storage.data
                [8];
        if (uVar1 == '\x01') {
          uVar18 = 0xc2;
        }
        else {
          if (uVar1 == '\x04') goto LAB_002c11e8;
          if (uVar1 == '\b') {
            uVar18 = 0xc4;
          }
          else {
            uVar18 = 0xc3;
          }
        }
        local_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uVar8 = QGuiApplication::keyboardModifiers();
        QTouchEvent::QTouchEvent
                  ((QTouchEvent *)local_88,uVar18,device,uVar8,
                   pDVar21->spans[uVar15].entries[pDVar21->spans[uVar15].offsets[uVar20]].storage.
                   data + 0x10);
        local_88._0_8_ = QFontMetrics::leading;
        if (cVar4 == '\0') {
          pQVar19 = this;
          if (piVar11[1] == 0) {
            pQVar19 = (QWidget *)0x0;
          }
        }
        else {
          pQVar19 = (QWidget *)0x0;
        }
        bVar5 = updateTouchPointsForWidget(pQVar19,(QTouchEvent *)local_88);
        QPointerEvent::setTimestamp((ulonglong)local_88);
        if (cVar4 == '\0') {
          piVar12 = piVar11 + 1;
          local_48 = this;
          if (piVar11[1] == 0) {
            local_48 = (QWidget *)0x0;
          }
          if (bVar5) {
            QWidget::setAttribute(this,WA_WState_AcceptedTouchBeginEvent,true);
          }
          if (local_88._8_2_ == 0xc2) {
            pQVar19 = this;
            if (*piVar12 == 0) {
              pQVar19 = (QWidget *)0x0;
            }
            if (te[0xb] != (QTouchEvent)0x1) goto LAB_002c11ab;
            goto LAB_002c1135;
          }
          bVar5 = QWidget::testAttribute_helper(this,WA_WState_AcceptedTouchBeginEvent);
          if ((bVar5) || (bVar5 = QGestureManager::gesturePending(o), bVar5)) {
            pQVar19 = this;
            if (*piVar12 == 0) {
              pQVar19 = (QWidget *)0x0;
            }
            if (te[0xb] == (QTouchEvent)0x1) {
              cVar4 = QCoreApplication::sendSpontaneousEvent
                                (&pQVar19->super_QObject,(QEvent *)local_88);
            }
            else {
              cVar4 = QCoreApplication::sendEvent(&pQVar19->super_QObject,(QEvent *)local_88);
            }
            if (cVar4 != '\0') {
              o = (QObject *)CONCAT71((int7)((ulong)o >> 8),(byte)o | local_88[0xc]);
            }
            if (((local_88._8_2_ == 0xc4) && (this != (QWidget *)0x0)) && (*piVar12 != 0)) {
              bVar5 = false;
              goto LAB_002c12b7;
            }
          }
LAB_002c12ce:
          QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)local_88);
          goto LAB_002c12d8;
        }
        local_48 = (QWidget *)0x0;
        pQVar19 = (QWidget *)0x0;
        if (te[0xb] == (QTouchEvent)0x0) {
LAB_002c11ab:
          uVar14 = QCoreApplication::sendEvent(&pQVar19->super_QObject,(QEvent *)local_88);
        }
        else {
LAB_002c1135:
          uVar14 = QCoreApplication::sendSpontaneousEvent
                             (&pQVar19->super_QObject,(QEvent *)local_88);
        }
        if (((char)uVar14 == '\0') || (local_88[0xc] != '\x01')) {
          QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)local_88);
          goto LAB_002c11e8;
        }
        if (cVar4 == '\0') {
          bVar5 = true;
          if ((this == (QWidget *)0x0) || (piVar11[1] == 0)) {
            o = (QObject *)CONCAT71((int7)((ulong)uVar14 >> 8),1);
          }
          else {
            o = (QObject *)CONCAT71((uint7)(uint3)((uint)piVar11[1] >> 8),1);
LAB_002c12b7:
            QWidget::setAttribute(this,WA_WState_AcceptedTouchBeginEvent,bVar5);
          }
          goto LAB_002c12ce;
        }
        uVar14 = QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)local_88);
        o = (QObject *)CONCAT71((int7)((ulong)uVar14 >> 8),1);
      }
      else {
LAB_002c11e8:
        if (cVar4 == '\0') {
LAB_002c12d8:
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            operator_delete(piVar11);
          }
        }
      }
      do {
        if (pDVar21->numBuckets - 1 == uVar17) {
          pDVar21 = (Data *)0x0;
          uVar17 = 0;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (pDVar21->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
    } while ((pDVar21 != (Data *)0x0) || (uVar17 != 0));
  }
  bVar24 = (byte)o;
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_a8);
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::~QHash(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar24 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window, const QTouchEvent *te)
{
    QApplicationPrivate *d = self;
    // TODO get rid of this std::pair
    typedef std::pair<QEventPoint::State, QList<QEventPoint> > StatesAndTouchPoints;
    QHash<QWidget *, StatesAndTouchPoints> widgetsNeedingEvents;

    const auto *device = te->pointingDevice();
    auto touchPoints = te->points(); // touch points will be mutated
    for (auto &touchPoint : touchPoints) {
        // update state
        QPointer<QObject> target;
        if (touchPoint.state() == QEventPoint::State::Pressed) {
            if (device->type() == QInputDevice::DeviceType::TouchPad) {
                // on touchpads, send all touch points to the same widget:
                // pick the first non-null target if possible
                target = QPointingDevicePrivate::get(device)->firstActiveTarget();
            }

            if (target.isNull()) {
                // determine which widget this event will go to
                if (!window)
                    window = QApplication::topLevelAt(touchPoint.globalPosition().toPoint());
                if (!window)
                    continue;
                target = window->childAt(window->mapFromGlobal(touchPoint.globalPosition().toPoint()));
                if (!target)
                    target = window;
            }

            bool usingClosestWidget = false;
            if (device->type() == QInputDevice::DeviceType::TouchScreen) {
                QWidget *closestWidget = d->findClosestTouchPointTarget(device, touchPoint);
                QWidget *widget = static_cast<QWidget *>(target.data());
                if (closestWidget
                        && (widget->isAncestorOf(closestWidget) || closestWidget->isAncestorOf(widget))) {
                    target = closestWidget;
                    usingClosestWidget = true;
                }
            }

            // on touch pads, implicitly grab all touch points
            // on touch screens, grab touch points that are redirected to the closest widget
            if (device->type() == QInputDevice::DeviceType::TouchPad || usingClosestWidget)
                QMutableEventPoint::setTarget(touchPoint, target);
        } else {
            target = QMutableEventPoint::target(touchPoint);
            if (!target)
                continue;
        }
        Q_ASSERT(!target.isNull());

        QWidget *targetWidget = static_cast<QWidget *>(target.data());

#ifdef Q_OS_MACOS
        // Single-touch events are normally not sent unless WA_TouchPadAcceptSingleTouchEvents is set.
        // In Qt 4 this check was in OS X-only code. That behavior is preserved here by the #ifdef.
        if (touchPoints.count() == 1
            && device->type() == QInputDevice::DeviceType::TouchPad
            && !targetWidget->testAttribute(Qt::WA_TouchPadAcceptSingleTouchEvents))
            continue;
#endif

        StatesAndTouchPoints &maskAndPoints = widgetsNeedingEvents[targetWidget];
        maskAndPoints.first = QEventPoint::State(maskAndPoints.first | touchPoint.state());
        maskAndPoints.second.append(touchPoint);
    }

    if (widgetsNeedingEvents.isEmpty())
        return false;

    bool accepted = false;
    QHash<QWidget *, StatesAndTouchPoints>::ConstIterator it = widgetsNeedingEvents.constBegin();
    const QHash<QWidget *, StatesAndTouchPoints>::ConstIterator end = widgetsNeedingEvents.constEnd();
    for (; it != end; ++it) {
        const QPointer<QWidget> widget = it.key();
        if (!QApplicationPrivate::tryModalHelper(widget, nullptr))
            continue;

        QEvent::Type eventType;
        switch (it.value().first) {
        case QEventPoint::State::Pressed:
            eventType = QEvent::TouchBegin;
            break;
        case QEventPoint::State::Released:
            eventType = QEvent::TouchEnd;
            break;
        case QEventPoint::State::Stationary:
            // don't send the event if nothing changed
            continue;
        default:
            eventType = QEvent::TouchUpdate;
            break;
        }

        QMutableTouchEvent touchEvent(eventType, device, QGuiApplication::keyboardModifiers(),
                                      it.value().second);
        bool containsPress = updateTouchPointsForWidget(widget, &touchEvent);
        touchEvent.setTimestamp(te->timestamp());
        touchEvent.setTarget(widget);

        if (containsPress)
            widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);

        switch (touchEvent.type()) {
        case QEvent::TouchBegin:
        {
            // if the TouchBegin handler recurses, we assume that means the event
            // has been implicitly accepted and continue to send touch events
            bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                         : QApplication::sendEvent(widget, &touchEvent);
            if (res && touchEvent.isAccepted()) {
                accepted = true;
                if (!widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);
            }
            break;
        }
        default:
            if (widget->testAttribute(Qt::WA_WState_AcceptedTouchBeginEvent)
#ifndef QT_NO_GESTURES
                || QGestureManager::gesturePending(widget)
#endif
                ) {
                bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                            : QApplication::sendEvent(widget, &touchEvent);
                if (res && touchEvent.isAccepted())
                    accepted = true;
                // widget can be deleted on TouchEnd
                if (touchEvent.type() == QEvent::TouchEnd && !widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent, false);
            }
            break;
        }
    }
    return accepted;
}